

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

void __thiscall S2Polyline::S2Polyline(S2Polyline *this,S2Polyline *other)

{
  int iVar1;
  int local_1c;
  S2Polyline *local_18;
  S2Polyline *other_local;
  S2Polyline *this_local;
  
  local_18 = other;
  other_local = this;
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polyline_0062ebc0;
  this->s2debug_override_ = local_18->s2debug_override_;
  local_1c = 0;
  iVar1 = absl::exchange<int,int>(&local_18->num_vertices_,&local_1c);
  this->num_vertices_ = iVar1;
  std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::unique_ptr
            (&this->vertices_,&local_18->vertices_);
  return;
}

Assistant:

S2Polyline::S2Polyline(S2Polyline&& other)
  : s2debug_override_(other.s2debug_override_),
    num_vertices_(absl::exchange(other.num_vertices_, 0)),
    vertices_(std::move(other.vertices_)) {
}